

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

void __thiscall MipsParser::setOmittedRegisters(MipsParser *this,tMipsOpcode *opcode)

{
  tMipsOpcode *opcode_local;
  MipsParser *this_local;
  
  if ((opcode->flags & 4U) != 0) {
    MipsRegisterValue::operator=(&(this->registers).grd,(MipsRegisterValue *)this);
  }
  if ((opcode->flags & 8U) != 0) {
    MipsRegisterValue::operator=(&(this->registers).grt,(MipsRegisterValue *)this);
  }
  if ((opcode->flags & 0x10U) != 0) {
    MipsRegisterValue::operator=(&(this->registers).grt,&(this->registers).grd);
  }
  if ((opcode->flags & 0x200U) != 0) {
    MipsRegisterValue::operator=(&(this->registers).frd,&(this->registers).frs);
  }
  if ((opcode->flags & 0x1000000U) != 0) {
    MipsRegisterValue::operator=(&(this->registers).rspvrd,&(this->registers).rspvrs);
  }
  return;
}

Assistant:

void MipsParser::setOmittedRegisters(const tMipsOpcode& opcode)
{
	// copy over omitted registers
	if (opcode.flags & MO_RSD)
		registers.grd = registers.grs;

	if (opcode.flags & MO_RST)
		registers.grt = registers.grs;

	if (opcode.flags & MO_RDT)
		registers.grt = registers.grd;

	if (opcode.flags & MO_FRSD)
		registers.frd = registers.frs;

	if (opcode.flags & MO_RSP_VRSD)
		registers.rspvrd = registers.rspvrs;
}